

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<int>::PrepareZ
          (TPZMatrix<int> *this,TPZFMatrix<int> *y,TPZFMatrix<int> *z,int beta,int opt)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  long col;
  int64_t i;
  long lVar5;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar2 = (y->super_TPZMatrix<int>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<int>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])(z);
  col = 0;
  lVar4 = lVar1;
  if (lVar1 < 1) {
    lVar4 = col;
  }
  if (lVar2 < 1) {
    lVar2 = col;
  }
  for (; col != lVar2; col = col + 1) {
    piVar3 = TPZFMatrix<int>::operator()(z,0,col);
    if (beta == 0) {
      for (lVar5 = 0; lVar1 * 4 - lVar5 != 0; lVar5 = lVar5 + 4) {
        *(undefined4 *)((long)piVar3 + lVar5) = 0;
      }
    }
    else {
      if (z != y) {
        memcpy(piVar3,y->fElem + (y->super_TPZMatrix<int>).super_TPZBaseMatrix.fRow * col,lVar1 * 4)
        ;
      }
      for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
        piVar3 = TPZFMatrix<int>::operator()(z,lVar5,col);
        *piVar3 = *piVar3 * beta;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}